

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O1

int __thiscall NetQuantize::quantize_convolution(NetQuantize *this)

{
  pointer *this_00;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  pointer __ptr;
  _Base_ptr p_Var3;
  long *plVar4;
  _Base_ptr p_Var5;
  int *piVar6;
  pointer piVar7;
  pointer pMVar8;
  pointer __ptr_00;
  long *plVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  iterator iVar13;
  size_t sVar14;
  iterator iVar15;
  int iVar16;
  uint uVar17;
  int unaff_EBP;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  Option opt_q;
  char key [256];
  undefined1 local_2f8 [32];
  Allocator *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  int local_2c0;
  pointer local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  Mat local_2a8;
  Mat local_258;
  undefined8 local_210;
  pointer local_208;
  Option *local_200;
  _Base_ptr local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1f0;
  _Base_ptr local_1e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
  *local_1e0;
  Mat local_1d8;
  undefined8 local_188;
  undefined8 uStack_180;
  Option local_178;
  char local_138 [264];
  
  pvVar1 = (this->super_ModelWriter).layers;
  uVar17 = (uint)((ulong)((long)(pvVar1->
                                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar1->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar17) {
    local_1e0 = &this->blob_int8scale_table;
    local_1e8 = &(this->blob_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1f0 = &this->weight_int8scale_table;
    local_1f8 = &(this->weight_int8scale_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_200 = &(this->super_ModelWriter).super_Net.opt;
    uVar18 = 0;
    do {
      iVar12 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar18]->type);
      iVar16 = unaff_EBP;
      if (iVar12 == 0) {
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                 ::find(&local_1e0->_M_t,
                        &(((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar18]->name);
        bVar11 = false;
        if (iVar13._M_node != local_1e8) {
          sprintf(local_138,"%s_param_0",
                  ((((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar18]->name)._M_dataplus._M_p);
          local_2f8._0_8_ = local_2f8 + 0x10;
          sVar14 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2f8,local_138,local_138 + sVar14);
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ncnn::Mat>_>_>
                   ::find(&local_1f0->_M_t,(key_type *)local_2f8);
          if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
            operator_delete((void *)local_2f8._0_8_);
          }
          if (iVar15._M_node == local_1f8) {
            quantize_convolution();
            iVar16 = -1;
            bVar11 = true;
          }
          else {
            pLVar2 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar18];
            __ptr = *(pointer *)(iVar13._M_node + 2);
            p_Var3 = iVar13._M_node[2]._M_parent;
            local_208 = (pointer)iVar13._M_node[2]._M_left;
            local_2ac = *(undefined4 *)&iVar13._M_node[2]._M_right;
            plVar4 = *(long **)(iVar13._M_node + 3);
            local_188 = iVar13._M_node[3]._M_parent;
            uStack_180 = iVar13._M_node[3]._M_left;
            local_2b0 = *(undefined4 *)&iVar13._M_node[3]._M_right;
            local_210 = *(undefined8 *)(iVar13._M_node + 4);
            if (p_Var3 != (_Base_ptr)0x0) {
              LOCK();
              p_Var3->_M_color = p_Var3->_M_color + _S_black;
              UNLOCK();
            }
            local_2f8._0_8_ = *(undefined8 *)(iVar15._M_node + 2);
            p_Var5 = iVar15._M_node[2]._M_parent;
            local_2f8._8_4_ = SUB84(p_Var5,0);
            local_2f8._12_4_ = (undefined4)((ulong)p_Var5 >> 0x20);
            local_2f8._16_4_ = SUB84(iVar15._M_node[2]._M_left,0);
            local_2f8._20_4_ = (undefined4)((ulong)iVar15._M_node[2]._M_left >> 0x20);
            local_2f8._24_4_ = *(undefined4 *)&iVar15._M_node[2]._M_right;
            local_2d8 = *(Allocator **)(iVar15._M_node + 3);
            local_2d0 = iVar15._M_node[3]._M_parent;
            uStack_2c8 = iVar15._M_node[3]._M_left;
            local_2c0 = *(int *)&iVar15._M_node[3]._M_right;
            local_2b8 = *(pointer *)(iVar15._M_node + 4);
            if (p_Var5 != (_Base_ptr)0x0) {
              LOCK();
              p_Var5->_M_color = p_Var5->_M_color + _S_black;
              UNLOCK();
            }
            fprintf(_stderr,"quantize_convolution %s\n",(pLVar2->name)._M_dataplus._M_p);
            iVar16 = *(int *)&pLVar2[1].one_blob_only * *(int *)((long)&pLVar2[1]._vptr_Layer + 4);
            uVar10 = (long)*(int *)((long)&pLVar2[1].type._M_dataplus._M_p + 4) /
                     (long)*(int *)&pLVar2[1]._vptr_Layer;
            this_00 = &pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            ncnn::Mat::reshape(&local_1d8,(Mat *)this_00,iVar16,
                               (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                           uVar10 & 0xffffffff) / (long)iVar16),
                               *(int *)&pLVar2[1]._vptr_Layer,(Allocator *)0x0);
            local_258.cstep = 0;
            local_258.data = (void *)0x0;
            local_258.refcount._0_4_ = 0;
            local_258.refcount._4_4_ = 0;
            local_258.elemsize._0_4_ = 0;
            local_258._20_8_ = 0;
            local_258.h = 0;
            local_258.d = 0;
            local_258.c = 0;
            local_258.allocator = (Allocator *)0x0;
            local_258.dims = 0;
            local_258.w = 0;
            local_178.lightmode = local_200->lightmode;
            local_178._1_3_ = *(undefined3 *)&local_200->field_0x1;
            local_178.num_threads = local_200->num_threads;
            local_178.workspace_allocator = local_200->workspace_allocator;
            local_178.openmp_blocktime = local_200->openmp_blocktime;
            local_178.use_winograd_convolution = local_200->use_winograd_convolution;
            local_178.use_sgemm_convolution = local_200->use_sgemm_convolution;
            local_178.use_int8_inference = local_200->use_int8_inference;
            local_178.use_vulkan_compute = local_200->use_vulkan_compute;
            uVar10._0_1_ = local_200->use_bf16_storage;
            uVar10._1_1_ = local_200->use_fp16_packed;
            uVar10._2_1_ = local_200->use_fp16_storage;
            uVar10._3_1_ = local_200->use_fp16_arithmetic;
            uVar10._4_1_ = local_200->use_int8_packed;
            uVar10._5_1_ = local_200->use_int8_storage;
            uVar10._6_1_ = local_200->use_int8_arithmetic;
            uVar10._7_1_ = local_200->use_packing_layout;
            local_178.use_shader_pack8 = local_200->use_shader_pack8;
            local_178.use_subgroup_basic = local_200->use_subgroup_basic;
            local_178.use_subgroup_vote = local_200->use_subgroup_vote;
            local_178.use_subgroup_ballot = local_200->use_subgroup_ballot;
            local_178.use_subgroup_shuffle = local_200->use_subgroup_shuffle;
            local_178.use_image_storage = local_200->use_image_storage;
            local_178.use_tensor_storage = local_200->use_tensor_storage;
            local_178.use_reserved_0 = local_200->use_reserved_0;
            local_178.flush_denormals = local_200->flush_denormals;
            local_178.use_local_pool_allocator = local_200->use_local_pool_allocator;
            local_178.use_shader_local_memory = local_200->use_shader_local_memory;
            local_178.use_cooperative_matrix = local_200->use_cooperative_matrix;
            local_178.use_winograd23_convolution = local_200->use_winograd23_convolution;
            local_178.use_winograd43_convolution = local_200->use_winograd43_convolution;
            local_178.use_winograd63_convolution = local_200->use_winograd63_convolution;
            local_178.use_reserved_6 = local_200->use_reserved_6;
            local_178.use_reserved_7 = local_200->use_reserved_7;
            local_178.use_reserved_8 = local_200->use_reserved_8;
            local_178.use_reserved_9 = local_200->use_reserved_9;
            local_178.use_reserved_10 = local_200->use_reserved_10;
            local_178.use_reserved_11 = local_200->use_reserved_11;
            local_178.blob_allocator =
                 (Allocator *)
                 pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_178._32_8_ = uVar10 & 0xffffffffffffff;
            ncnn::quantize_to_int8(&local_1d8,&local_258,(Mat *)local_2f8,&local_178);
            bVar19 = local_258.data != (void *)0x0;
            bVar20 = (long)local_258.c * local_258.cstep != 0;
            iVar16 = -100;
            if (bVar19 && bVar20) {
              ncnn::Mat::reshape(&local_2a8,&local_258,
                                 *(int *)((long)&pLVar2[1].type._M_dataplus._M_p + 4),
                                 (Allocator *)0x0);
              if ((Mat *)this_00 != &local_2a8) {
                piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    piVar7 = pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                    pMVar8 = pLVar2[1].bottom_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage;
                    if (pMVar8 == (pointer)0x0) {
                      if (piVar7 != (pointer)0x0) {
                        free(piVar7);
                      }
                    }
                    else {
                      (**(code **)((long)pMVar8->data + 0x18))();
                    }
                  }
                }
                pLVar2[2]._vptr_Layer = (_func_int **)0x0;
                *(undefined8 *)
                 ((long)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4) = 0;
                *(undefined8 *)
                 ((long)&pLVar2[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) = 0;
                *this_00 = (pointer)0x0;
                pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pLVar2[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_start = 0;
                pLVar2[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined4 *)
                 &pLVar2[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
                pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_2a8.data;
                pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                *(ulong *)&pLVar2[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data =
                     CONCAT44(local_2a8.elemsize._4_4_,(undefined4)local_2a8.elemsize);
                *(int *)&pLVar2[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_2a8.elempack;
                pLVar2[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2a8.allocator;
                *(int *)&pLVar2[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data = local_2a8.dims;
                *(int *)((long)&pLVar2[1].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start + 4) = local_2a8.w;
                *(int *)&pLVar2[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish = local_2a8.h;
                *(int *)((long)&pLVar2[1].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish + 4) = local_2a8.d;
                *(int *)&pLVar2[1].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = local_2a8.c;
                pLVar2[2]._vptr_Layer = (_func_int **)local_2a8.cstep;
              }
              piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if ((pointer)local_2a8.allocator == (pointer)0x0) {
                    if ((pointer)local_2a8.data != (pointer)0x0) {
                      free(local_2a8.data);
                    }
                  }
                  else {
                    (**(code **)((long)(local_2a8.allocator)->_vptr_Allocator + 0x18))();
                  }
                }
              }
              local_2a8.cstep = 0;
              local_2a8.data = (pointer)0x0;
              local_2a8.refcount._0_4_ = 0;
              local_2a8.refcount._4_4_ = 0;
              local_2a8.elemsize._0_4_ = 0;
              local_2a8.elemsize._4_4_ = 0;
              local_2a8.elempack = 0;
              local_2a8.dims = 0;
              local_2a8.w = 0;
              local_2a8.h = 0;
              local_2a8.d = 0;
              local_2a8.c = 0;
              iVar16 = unaff_EBP;
            }
            piVar6 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_258.allocator == (Allocator *)0x0) {
                  if (local_258.data != (void *)0x0) {
                    free(local_258.data);
                  }
                }
                else {
                  (*(local_258.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_258.cstep = 0;
            local_258.data = (void *)0x0;
            local_258.refcount._0_4_ = 0;
            local_258.refcount._4_4_ = 0;
            local_258.elemsize._0_4_ = 0;
            local_258._20_8_ = 0;
            local_258.dims = 0;
            local_258.w = 0;
            local_258.h = 0;
            local_258.d = 0;
            local_258.c = 0;
            piVar6 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_1d8.allocator == (Allocator *)0x0) {
                  if (local_1d8.data != (void *)0x0) {
                    free(local_1d8.data);
                  }
                }
                else {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_1d8.cstep = 0;
            local_1d8.data = (void *)0x0;
            local_1d8.refcount._0_4_ = 0;
            local_1d8.refcount._4_4_ = 0;
            local_1d8.elemsize._0_4_ = 0;
            local_1d8._20_8_ = 0;
            local_1d8.dims = 0;
            local_1d8.w = 0;
            local_1d8.h = 0;
            local_1d8.d = 0;
            local_1d8.c = 0;
            bVar11 = true;
            if (bVar19 && bVar20) {
              *(undefined4 *)&pLVar2[1].type._M_string_length = 2;
              if (&pLVar2[2].name != (string *)local_2f8) {
                piVar6 = (int *)CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                piVar6 = (int *)pLVar2[2].name._M_string_length;
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    __ptr_00 = pLVar2[2].name._M_dataplus._M_p;
                    plVar9 = *(long **)&pLVar2[2].bottoms.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data;
                    if (plVar9 == (long *)0x0) {
                      if (__ptr_00 != (pointer)0x0) {
                        free(__ptr_00);
                      }
                    }
                    else {
                      (**(code **)(*plVar9 + 0x18))();
                    }
                  }
                }
                pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined8 *)((long)&pLVar2[2].name._M_string_length + 4) = 0;
                *(undefined8 *)((long)&pLVar2[2].name.field_2 + 4) = 0;
                pLVar2[2].name._M_dataplus._M_p = (pointer)0x0;
                pLVar2[2].name._M_string_length = 0;
                pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                *(undefined4 *)
                 &pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = 0;
                pLVar2[2].name._M_dataplus._M_p = (pointer)local_2f8._0_8_;
                pLVar2[2].name._M_string_length = CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
                pLVar2[2].name.field_2._M_allocated_capacity =
                     CONCAT44(local_2f8._20_4_,local_2f8._16_4_);
                *(undefined4 *)((long)&pLVar2[2].name.field_2 + 8) = local_2f8._24_4_;
                *(Allocator **)
                 &pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data = local_2d8;
                *(int *)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = (int)local_2d0;
                *(int *)((long)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4) = local_2d0._4_4_;
                *(int *)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage = (int)uStack_2c8;
                *(int *)((long)&pLVar2[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                     uStack_2c8._4_4_;
                *(int *)&pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data = local_2c0;
                pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = local_2b8;
              }
              if (p_Var3 != (_Base_ptr)0x0) {
                LOCK();
                p_Var3->_M_color = p_Var3->_M_color + _S_black;
                UNLOCK();
              }
              piVar6 = *(int **)&pLVar2[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  piVar7 = pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                  plVar9 = *(long **)&pLVar2[2].top_shapes.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data;
                  if (plVar9 == (long *)0x0) {
                    if (piVar7 != (pointer)0x0) {
                      free(piVar7);
                    }
                  }
                  else {
                    (**(code **)(*plVar9 + 0x18))();
                  }
                }
              }
              pLVar2[3].one_blob_only = false;
              pLVar2[3].support_inplace = false;
              pLVar2[3].support_vulkan = false;
              pLVar2[3].support_packing = false;
              pLVar2[3].support_bf16_storage = false;
              pLVar2[3].support_fp16_storage = false;
              pLVar2[3].support_int8_storage = false;
              pLVar2[3].support_image_storage = false;
              *(undefined8 *)
               ((long)&pLVar2[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) = 0;
              *(undefined8 *)
               ((long)&pLVar2[2].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = 0;
              pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = 0;
              pLVar2[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = __ptr;
              *(_Base_ptr *)
               &pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data = p_Var3;
              pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = local_208;
              *(undefined4 *)
               &pLVar2[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = local_2ac;
              *(long **)&pLVar2[2].top_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data = plVar4;
              *(undefined4 *)
               &pLVar2[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_finish = (undefined4)local_188;
              *(undefined4 *)
               ((long)&pLVar2[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4) = local_188._4_4_;
              *(undefined4 *)
               &pLVar2[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (undefined4)uStack_180;
              *(undefined4 *)
               ((long)&pLVar2[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4) = uStack_180._4_4_;
              *(undefined4 *)&pLVar2[3]._vptr_Layer = local_2b0;
              pLVar2[3].one_blob_only = (bool)(undefined1)local_210;
              pLVar2[3].support_inplace = (bool)local_210._1_1_;
              pLVar2[3].support_vulkan = (bool)local_210._2_1_;
              pLVar2[3].support_packing = (bool)local_210._3_1_;
              pLVar2[3].support_bf16_storage = (bool)local_210._4_1_;
              pLVar2[3].support_fp16_storage = (bool)local_210._5_1_;
              pLVar2[3].support_int8_storage = (bool)local_210._6_1_;
              pLVar2[3].support_image_storage = (bool)local_210._7_1_;
              bVar11 = false;
            }
            piVar6 = (int *)CONCAT44(local_2f8._12_4_,local_2f8._8_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_2d8 == (Allocator *)0x0) {
                  if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
                    free((void *)local_2f8._0_8_);
                  }
                }
                else {
                  (*local_2d8->_vptr_Allocator[3])();
                }
              }
            }
            local_2b8 = (pointer)0x0;
            local_2f8._0_8_ = (pointer)0x0;
            local_2f8._8_4_ = 0;
            local_2f8._12_4_ = 0;
            local_2f8._16_4_ = 0;
            local_2f8._20_4_ = 0;
            local_2f8._24_4_ = 0;
            local_2d0._0_4_ = 0;
            local_2d0._4_4_ = 0;
            uStack_2c8._0_4_ = 0;
            uStack_2c8._4_4_ = 0;
            local_2c0 = 0;
            if (p_Var3 != (_Base_ptr)0x0) {
              LOCK();
              p_Var3->_M_color = p_Var3->_M_color - _S_black;
              UNLOCK();
              if (p_Var3->_M_color == _S_red) {
                if (plVar4 == (long *)0x0) {
                  if (__ptr != (pointer)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*plVar4 + 0x18))(plVar4,__ptr);
                }
              }
            }
          }
        }
        if (bVar11) {
          return iVar16;
        }
      }
      uVar18 = uVar18 + 1;
      unaff_EBP = iVar16;
    } while ((uVar17 & 0x7fffffff) != uVar18);
  }
  return 0;
}

Assistant:

int NetQuantize::quantize_convolution()
{
    const int layer_count = static_cast<int>(layers.size());
    for (int i = 0; i < layer_count; i++)
    {
        // find convolution layer
        if (layers[i]->type != "Convolution")
            continue;

        // find convolution layer
        std::map<std::string, ncnn::Mat>::iterator iter_data = blob_int8scale_table.find(layers[i]->name);
        if (iter_data == blob_int8scale_table.end())
            continue;

        char key[256];
        sprintf(key, "%s_param_0", layers[i]->name.c_str());

        std::map<std::string, ncnn::Mat>::iterator iter = weight_int8scale_table.find(key);
        if (iter == weight_int8scale_table.end())
        {
            fprintf(stderr, "this layer need to be quantized, but no scale param!\n");
            return -1;
        }

        // Convolution - quantize weight from fp32 to int8
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[i];

        ncnn::Mat bottom_blob_int8_scales = iter_data->second;
        ncnn::Mat weight_data_int8_scales = iter->second;

        fprintf(stderr, "quantize_convolution %s\n", convolution->name.c_str());

        {
            const int maxk = convolution->kernel_w * convolution->kernel_h;
            const int num_input = convolution->weight_data_size / convolution->num_output / maxk;

            ncnn::Mat weight_data_r2 = convolution->weight_data.reshape(maxk, num_input, convolution->num_output);

            ncnn::Mat weight_data_int8;

            ncnn::Option opt_q = opt;
            opt_q.blob_allocator = convolution->weight_data.allocator;
            opt_q.use_packing_layout = false;
            ncnn::quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
            if (weight_data_int8.empty())
                return -100;

            convolution->weight_data = weight_data_int8.reshape(convolution->weight_data_size);
        }

        convolution->int8_scale_term = 2;
        convolution->weight_data_int8_scales = weight_data_int8_scales;
        convolution->bottom_blob_int8_scales = bottom_blob_int8_scales;
    }

    return 0;
}